

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderCase.cpp
# Opt level: O0

Texture2D * __thiscall deqp::gls::RandomShaderCase::getTex2D(RandomShaderCase *this)

{
  deUint32 texture;
  GLenum err;
  Texture2D *this_00;
  Texture2D *pTVar1;
  PixelBufferAccess *access;
  Vector<float,_4> local_3c;
  Vector<float,_4> local_2c;
  RandomShaderCase *local_10;
  RandomShaderCase *this_local;
  
  if (this->m_tex2D == (Texture2D *)0x0) {
    local_10 = this;
    this_00 = (Texture2D *)operator_new(0x70);
    glu::Texture2D::Texture2D(this_00,this->m_renderCtx,0x1908,0x1401,0x40,0x40);
    this->m_tex2D = this_00;
    pTVar1 = glu::Texture2D::getRefTexture(this->m_tex2D);
    tcu::Texture2D::allocLevel(pTVar1,0);
    pTVar1 = glu::Texture2D::getRefTexture(this->m_tex2D);
    access = tcu::TextureLevelPyramid::getLevel(&pTVar1->super_TextureLevelPyramid,0);
    tcu::Vector<float,_4>::Vector(&local_2c,-1.0,-1.0,-1.0,2.0);
    tcu::Vector<float,_4>::Vector(&local_3c,1.0,1.0,1.0,0.0);
    tcu::fillWithComponentGradients(access,&local_2c,&local_3c);
    (*this->m_tex2D->_vptr_Texture2D[2])();
    texture = glu::Texture2D::getGLTexture(this->m_tex2D);
    glwBindTexture(0xde1,texture);
    glwTexParameteri(0xde1,0x2802,0x812f);
    glwTexParameteri(0xde1,0x2803,0x812f);
    glwTexParameteri(0xde1,0x2801,0x2601);
    glwTexParameteri(0xde1,0x2800,0x2601);
    err = glwGetError();
    glu::checkError(err,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                    ,0x137);
  }
  return this->m_tex2D;
}

Assistant:

const glu::Texture2D* RandomShaderCase::getTex2D (void)
{
	if (!m_tex2D)
	{
		m_tex2D = new glu::Texture2D(m_renderCtx, TEXTURE_2D_FORMAT, TEXTURE_2D_DATA_TYPE, TEXTURE_2D_WIDTH, TEXTURE_2D_HEIGHT);

		m_tex2D->getRefTexture().allocLevel(0);
		tcu::fillWithComponentGradients(m_tex2D->getRefTexture().getLevel(0), tcu::Vec4(-1.0f, -1.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f));
		m_tex2D->upload();

		// Setup parameters.
		glBindTexture(GL_TEXTURE_2D, m_tex2D->getGLTexture());
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		TEXTURE_WRAP_S);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		TEXTURE_WRAP_T);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	TEXTURE_MIN_FILTER);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	TEXTURE_MAG_FILTER);

		GLU_CHECK();
	}

	return m_tex2D;
}